

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_TestShell::createTest
          (TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_TestShell
           *this)

{
  Utest *this_00;
  TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_TestShell
  *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
                                  ,0x23f);
  TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_Test::
  TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_Test
            ((TEST_MockReturnValueTest_UnsignedLongLongIntegerReturnValueSetsDifferentValues_Test *)
             this_00);
  return this_00;
}

Assistant:

TEST(MockReturnValueTest, UnsignedLongLongIntegerReturnValueSetsDifferentValues)
{
    unsigned long long int expected_value = 1;
    unsigned long long int another_expected_value = 2;

    mock().expectOneCall("foo").andReturnValue(expected_value);
    mock().expectOneCall("foo").andReturnValue(another_expected_value);

    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(expected_value, mock().returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(another_expected_value, mock().actualCall("foo").returnValue().getUnsignedLongLongIntValue());
    UNSIGNED_LONGLONGS_EQUAL(another_expected_value, mock().returnValue().getUnsignedLongLongIntValue());
}